

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent *indent)

{
  char *permissions_dir;
  cmInstallType type_00;
  bool bVar1;
  uint uVar2;
  cmLocalGenerator *pcVar3;
  char *pcVar4;
  cmMakefile *this_00;
  string *psVar5;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  char *permissions_file;
  char *literal_args_00;
  string *pdbName;
  TweakMethod tweak;
  byte local_7a9;
  string local_678;
  byte local_651;
  char *pcStack_650;
  bool optional;
  char *no_rename;
  char *no_dir_permissions;
  undefined8 uStack_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5f0 [8];
  string toRealName;
  string fromRealName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined1 local_570 [8];
  string toSOName;
  string fromSOName;
  string toName;
  string fromName;
  undefined1 local_4e8 [7];
  bool haveNamelink;
  string to1_4;
  string from1_4;
  string targetNameBase;
  string to1_3;
  undefined1 local_448 [8];
  string from1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  string targetNameImportLib_1;
  string to1_2;
  string from1_2;
  string targetNamePDB_1;
  string targetNameImport_1;
  string targetNameReal_1;
  string targetNameSO;
  string targetName_1;
  string to2;
  string from2;
  cmMakefile *mf;
  string to1_1;
  string from1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  string targetNameImportLib;
  string to1;
  string from1;
  string targetNamePDB;
  string targetNameImport;
  string targetNameReal;
  string targetName;
  string local_138;
  cmInstallType local_118;
  TargetType local_114;
  cmInstallType type;
  TargetType targetType;
  string literal_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesTo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesFrom;
  undefined1 local_a0 [8];
  string toDir;
  undefined1 local_50 [8];
  string fromDirConfig;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  
  fromDirConfig.field_2._8_8_ = indent;
  std::__cxx11::string::string((string *)local_50);
  bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar1) {
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(pcVar3);
    std::__cxx11::string::operator=((string *)local_50,pcVar4);
    pcVar4 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)local_50,pcVar4);
    std::__cxx11::string::operator+=((string *)local_50,"/CMakeRelink.dir/");
  }
  else {
    cmGeneratorTarget::GetDirectory
              ((string *)((long)&toDir.field_2 + 8),this->Target,config,
               (bool)(this->ImportLibrary & 1));
    std::__cxx11::string::operator=((string *)local_50,(string *)(toDir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(toDir.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_50,"/");
  }
  GetDestination((string *)
                 &filesFrom.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this,config);
  cmInstallGenerator::ConvertToAbsoluteDestination
            ((string *)local_a0,&this->super_cmInstallGenerator,
             (string *)
             &filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &filesFrom.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator+=((string *)local_a0,"/");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&filesTo.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&literal_args.field_2 + 8));
  std::__cxx11::string::string((string *)&type);
  local_114 = cmGeneratorTarget::GetType(this->Target);
  local_118 = cmInstallType_EXECUTABLE;
  switch(local_114) {
  case EXECUTABLE:
    local_118 = cmInstallType_EXECUTABLE;
    break;
  case STATIC_LIBRARY:
    local_118 = cmInstallType_STATIC_LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_118 = cmInstallType_SHARED_LIBRARY;
    break;
  case MODULE_LIBRARY:
    local_118 = cmInstallType_MODULE_LIBRARY;
    break;
  case OBJECT_LIBRARY:
  case UTILITY:
  case GLOBAL_TARGET:
  case UNKNOWN_LIBRARY:
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,"cmInstallTargetGenerator created with non-installable target.",
               (allocator *)(targetName.field_2._M_local_buf + 0xf));
    cmLocalGenerator::IssueMessage(pcVar3,INTERNAL_ERROR,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    targetName.field_2._8_4_ = 1;
    goto LAB_00882490;
  case INTERFACE_LIBRARY:
    __assert_fail("0 && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x6c,
                  "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, const Indent &)"
                 );
  }
  if (local_114 == EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x79,
                    "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, const Indent &)"
                   );
    }
    std::__cxx11::string::string((string *)(targetNameReal.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameImport.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNamePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(from1.field_2._M_local_buf + 8));
    pdbName = config;
    cmGeneratorTarget::GetExecutableNames
              (this->Target,(string *)(targetNameReal.field_2._M_local_buf + 8),
               (string *)(targetNameImport.field_2._M_local_buf + 8),
               (string *)(targetNamePDB.field_2._M_local_buf + 8),
               (string *)(from1.field_2._M_local_buf + 8),config);
    if ((this->ImportLibrary & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameReal.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameReal.field_2 + 8));
      bVar1 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar1) {
        this_00 = cmTarget::GetMakefile(this->Target->Target);
        local_118 = cmInstallType_DIRECTORY;
        std::__cxx11::string::operator+=((string *)&type," USE_SOURCE_PERMISSIONS");
        std::__cxx11::string::operator+=((string *)(to1_1.field_2._M_local_buf + 8),".app");
        std::__cxx11::string::operator+=((string *)&mf,".app/");
        bVar1 = cmMakefile::PlatformIsAppleIos(this_00);
        if (!bVar1) {
          std::__cxx11::string::operator+=((string *)&mf,"Contents/MacOS/");
        }
        std::__cxx11::string::operator+=
                  ((string *)&mf,(string *)(targetNameReal.field_2._M_local_buf + 8));
      }
      else {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNameImport.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNameReal.field_2 + 8));
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to2.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameImport.field_2 + 8));
          psVar5 = (string *)
                   std::__cxx11::string::operator+=
                             ((string *)local_a0,
                              (string *)(targetNameImport.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(targetName_1.field_2._M_local_buf + 8),psVar5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&filesTo.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)((long)&to2.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&literal_args.field_2 + 8),
                      (value_type *)((long)&targetName_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(targetName_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(to2.field_2._M_local_buf + 8));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1_1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),(value_type *)&mf);
      std::__cxx11::string::~string((string *)&mf);
      std::__cxx11::string::~string((string *)(to1_1.field_2._M_local_buf + 8));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNamePDB.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameImportLib.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNamePDB.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),
                  (value_type *)((long)&targetNameImportLib.field_2 + 8));
      std::__cxx11::string::string((string *)local_220);
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,(string *)((long)&targetNamePDB.field_2 + 8),
                         (string *)local_220,(char *)0x0);
      if (bVar1) {
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_220);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&from1_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_220);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),(value_type *)((long)&from1_1.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(from1_1.field_2._M_local_buf + 8));
      }
      local_118 = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string((string *)(targetNameImportLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)(from1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNamePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameImport.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameReal.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::string((string *)(targetNameSO.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameReal_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameImport_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNamePDB_1.field_2._M_local_buf + 8));
    pdbName = (string *)(from1_2.field_2._M_local_buf + 8);
    std::__cxx11::string::string((string *)pdbName);
    cmGeneratorTarget::GetLibraryNames
              (this->Target,(string *)(targetNameSO.field_2._M_local_buf + 8),
               (string *)(targetNameReal_1.field_2._M_local_buf + 8),
               (string *)(targetNameImport_1.field_2._M_local_buf + 8),
               (string *)(targetNamePDB_1.field_2._M_local_buf + 8),pdbName,config);
    if ((this->ImportLibrary & 1U) == 0) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (bVar1) {
        if (this->NamelinkMode != NamelinkModeNone) {
          __assert_fail("this->NamelinkMode == NamelinkModeNone",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmInstallTargetGenerator.cxx"
                        ,0xdc,
                        "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, const Indent &)"
                       );
        }
        local_118 = cmInstallType_DIRECTORY;
        std::__cxx11::string::operator+=((string *)&type," USE_SOURCE_PERMISSIONS");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&targetNameSO.field_2 + 8));
        cmsys::SystemTools::GetFilenamePath
                  ((string *)((long)&to1_3.field_2 + 8),(string *)local_448);
        std::__cxx11::string::operator=
                  ((string *)local_448,(string *)(to1_3.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(to1_3.field_2._M_local_buf + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&targetNameBase.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&targetNameImport_1.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_448);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),
                    (value_type *)((long)&targetNameBase.field_2 + 8));
        std::__cxx11::string::~string((string *)(targetNameBase.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_448);
      }
      else {
        bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar1) {
          local_118 = cmInstallType_DIRECTORY;
          std::__cxx11::string::operator+=((string *)&type," USE_SOURCE_PERMISSIONS");
          std::__cxx11::string::find((char)(&targetNameSO.field_2._M_allocated_capacity + 1),0x2f);
          std::__cxx11::string::substr
                    ((ulong)((long)&from1_4.field_2 + 8),
                     (ulong)(&targetNameSO.field_2._M_allocated_capacity + 1));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to1_4.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&from1_4.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameSO.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&filesTo.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)((long)&to1_4.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&literal_args.field_2 + 8),(value_type *)local_4e8);
          std::__cxx11::string::~string((string *)local_4e8);
          std::__cxx11::string::~string((string *)(to1_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(from1_4.field_2._M_local_buf + 8));
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&toName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameSO.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fromSOName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameSO.field_2 + 8));
          std::__cxx11::string::string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_570);
          fromName.field_2._M_local_buf[0xf] =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNameReal_1.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNameSO.field_2 + 8));
          if ((bool)fromName.field_2._M_local_buf[0xf]) {
            std::operator+(&local_590,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNameReal_1.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toSOName.field_2._M_local_buf + 8),(string *)&local_590);
            std::__cxx11::string::~string((string *)&local_590);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fromRealName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNameReal_1.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)local_570,(string *)(fromRealName.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(fromRealName.field_2._M_local_buf + 8));
          }
          std::__cxx11::string::string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_5f0);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameImport_1.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNameSO.field_2 + 8));
          if ((bVar1) &&
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNameImport_1.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNameReal_1.field_2 + 8)), bVar1)) {
            fromName.field_2._M_local_buf[0xf] = '\x01';
            std::operator+(&local_610,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNameImport_1.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toRealName.field_2._M_local_buf + 8),(string *)&local_610);
            std::__cxx11::string::~string((string *)&local_610);
            std::operator+(&local_630,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&targetNameImport_1.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_5f0,(string *)&local_630);
            std::__cxx11::string::~string((string *)&local_630);
          }
          if (fromName.field_2._M_local_buf[0xf] == '\0') {
            if (this->NamelinkMode != NamelinkModeOnly) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),
                          (value_type *)((long)&fromSOName.field_2 + 8));
            }
          }
          else if (this->NamelinkMode == NamelinkModeOnly) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&filesTo.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)((long)&toName.field_2 + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&literal_args.field_2 + 8),
                        (value_type *)((long)&fromSOName.field_2 + 8));
          }
          else {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toRealName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),(value_type *)local_5f0);
            }
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toSOName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),(value_type *)local_570);
            }
            if (this->NamelinkMode != NamelinkModeSkip) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filesTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)((long)&toName.field_2 + 8));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&literal_args.field_2 + 8),
                          (value_type *)((long)&fromSOName.field_2 + 8));
            }
          }
          std::__cxx11::string::~string((string *)local_5f0);
          std::__cxx11::string::~string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_570);
          std::__cxx11::string::~string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fromSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(toName.field_2._M_local_buf + 8));
        }
      }
    }
    else {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,200,
                      "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, const Indent &)"
                     );
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNamePDB_1.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNameImportLib_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNamePDB_1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (value_type *)((long)&to1_2.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&literal_args.field_2 + 8),
                  (value_type *)((long)&targetNameImportLib_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_3e8);
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,(string *)((long)&targetNamePDB_1.field_2 + 8),
                         (string *)local_3e8,(char *)0x0);
      if (bVar1) {
        std::operator+(&local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filesTo.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&from1_3.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&literal_args.field_2 + 8),(value_type *)((long)&from1_3.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(from1_3.field_2._M_local_buf + 8));
      }
      local_118 = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_3e8);
      std::__cxx11::string::~string((string *)(targetNameImportLib_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1_2.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)(from1_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNamePDB_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameImport_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameReal_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameSO.field_2._M_local_buf + 8));
  }
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&filesTo.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&literal_args.field_2 + 8));
  if (sVar7 != sVar8) {
    __assert_fail("filesFrom.size() == filesTo.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x146,
                  "virtual void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, const Indent &)"
                 );
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filesTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    targetName.field_2._8_4_ = 1;
  }
  else {
    no_dir_permissions = (char *)PreReplacementTweaks;
    uStack_638 = 0;
    AddTweak(this,os,(Indent *)fromDirConfig.field_2._8_8_,config,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&literal_args.field_2 + 8),(TweakMethod)pdbName);
    no_rename = (char *)0x0;
    pcStack_650 = (char *)0x0;
    local_7a9 = 1;
    if ((this->Optional & 1U) == 0) {
      local_7a9 = this->ImportLibrary;
    }
    local_651 = local_7a9 & 1;
    GetDestination(&local_678,this,config);
    type_00 = local_118;
    uVar2 = (uint)local_651;
    permissions_file = (char *)std::__cxx11::string::c_str();
    permissions_dir = no_rename;
    pcVar4 = pcStack_650;
    literal_args_00 = (char *)std::__cxx11::string::c_str();
    tweak = (TweakMethod)(uVar2 & 1);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&local_678,type_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&filesTo.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,SUB41(uVar2 & 1,0),
               permissions_file,permissions_dir,pcVar4,literal_args_00,
               (Indent *)fromDirConfig.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_678);
    AddTweak(this,os,(Indent *)fromDirConfig.field_2._8_8_,config,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&literal_args.field_2 + 8),tweak);
    targetName.field_2._8_4_ = 0;
  }
LAB_00882490:
  std::__cxx11::string::~string((string *)&type);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&literal_args.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&filesTo.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream& os,
                                                    const std::string& config,
                                                    Indent const& indent)
{
  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if(this->Target->NeedRelinkBeforeInstall(config))
    {
    fromDirConfig =
        this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory();
    fromDirConfig += cmake::GetCMakeFilesDirectory();
    fromDirConfig += "/CMakeRelink.dir/";
    }
  else
    {
    fromDirConfig =
        this->Target->GetDirectory(config, this->ImportLibrary);
    fromDirConfig += "/";
    }
  std::string toDir =
    this->ConvertToAbsoluteDestination(this->GetDestination(config));
  toDir += "/";

  // Compute the list of files to install for this target.
  std::vector<std::string> filesFrom;
  std::vector<std::string> filesTo;
  std::string literal_args;
  cmState::TargetType targetType = this->Target->GetType();
  cmInstallType type = cmInstallType();
  switch(targetType)
    {
    case cmState::EXECUTABLE: type = cmInstallType_EXECUTABLE; break;
    case cmState::STATIC_LIBRARY: type = cmInstallType_STATIC_LIBRARY; break;
    case cmState::SHARED_LIBRARY: type = cmInstallType_SHARED_LIBRARY; break;
    case cmState::MODULE_LIBRARY: type = cmInstallType_MODULE_LIBRARY; break;
    case cmState::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(0 && "INTERFACE_LIBRARY targets have no installable outputs.");
      break;
    case cmState::OBJECT_LIBRARY:
    case cmState::UTILITY:
    case cmState::GLOBAL_TARGET:
    case cmState::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(cmake::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return;
    }
  if(targetType == cmState::EXECUTABLE)
    {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    std::string targetName;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    this->Target->GetExecutableNames(targetName, targetNameReal,
                                     targetNameImport, targetNamePDB,
                                     config);
    if(this->ImportLibrary)
      {
      std::string from1 = fromDirConfig + targetNameImport;
      std::string to1 = toDir + targetNameImport;
      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      std::string targetNameImportLib;
      if(this->Target->GetImplibGNUtoMS(targetNameImport,
                                        targetNameImportLib))
        {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
        }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
      }
    else
      {
      std::string from1 = fromDirConfig + targetName;
      std::string to1 = toDir + targetName;

      // Handle OSX Bundles.
      if(this->Target->IsAppBundleOnApple())
        {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Install the whole app bundle directory.
        type = cmInstallType_DIRECTORY;
        literal_args += " USE_SOURCE_PERMISSIONS";
        from1 += ".app";

        // Tweaks apply to the binary inside the bundle.
        to1 += ".app/";
        if(!mf->PlatformIsAppleIos())
          {
          to1 += "Contents/MacOS/";
          }
        to1 += targetName;
        }
      else
        {
        // Tweaks apply to the real file, so list it first.
        if(targetNameReal != targetName)
          {
          std::string from2 = fromDirConfig + targetNameReal;
          std::string to2 = toDir += targetNameReal;
          filesFrom.push_back(from2);
          filesTo.push_back(to2);
          }
        }

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      }
    }
  else
    {
    std::string targetName;
    std::string targetNameSO;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    this->Target->GetLibraryNames(targetName, targetNameSO,
                                          targetNameReal,
                                  targetNameImport, targetNamePDB,
                                  config);
    if(this->ImportLibrary)
      {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNameImport;
      std::string to1 = toDir + targetNameImport;
      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      std::string targetNameImportLib;
      if(this->Target->GetImplibGNUtoMS(targetNameImport,
                                        targetNameImportLib))
        {
        filesFrom.push_back(fromDirConfig + targetNameImportLib);
        filesTo.push_back(toDir + targetNameImportLib);
        }

      // An import library looks like a static library.
      type = cmInstallType_STATIC_LIBRARY;
      }
    else if(this->Target->IsFrameworkOnApple())
      {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      // Install the whole framework directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string from1 = fromDirConfig + targetName;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = toDir + targetNameReal;

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      }
    else if(this->Target->IsCFBundleOnApple())
      {
      // Install the whole app bundle directory.
      type = cmInstallType_DIRECTORY;
      literal_args += " USE_SOURCE_PERMISSIONS";

      std::string targetNameBase = targetName.substr(0, targetName.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = toDir + targetName;

      filesFrom.push_back(from1);
      filesTo.push_back(to1);
      }
    else
      {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetName;
      std::string toName = toDir + targetName;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if(targetNameSO != targetName)
        {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNameSO;
        toSOName = toDir + targetNameSO;
        }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if(targetNameReal != targetName &&
         targetNameReal != targetNameSO)
        {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNameReal;
        toRealName = toDir + targetNameReal;
        }

      // Add the names based on the current namelink mode.
      if(haveNamelink)
        {
        // With a namelink we need to check the mode.
        if(this->NamelinkMode == NamelinkModeOnly)
          {
          // Install the namelink only.
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
          }
        else
          {
          // Install the real file if it has its own name.
          if(!fromRealName.empty())
            {
            filesFrom.push_back(fromRealName);
            filesTo.push_back(toRealName);
            }

          // Install the soname link if it has its own name.
          if(!fromSOName.empty())
            {
            filesFrom.push_back(fromSOName);
            filesTo.push_back(toSOName);
            }

          // Install the namelink if it is not to be skipped.
          if(this->NamelinkMode != NamelinkModeSkip)
            {
            filesFrom.push_back(fromName);
            filesTo.push_back(toName);
            }
          }
        }
      else
        {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if(this->NamelinkMode != NamelinkModeOnly)
          {
          filesFrom.push_back(fromName);
          filesTo.push_back(toName);
          }
        }
      }
    }

  // If this fails the above code is buggy.
  assert(filesFrom.size() == filesTo.size());

  // Skip this rule if no files are to be installed for the target.
  if(filesFrom.empty())
    {
    return;
    }

  // Add pre-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PreReplacementTweaks);

  // Write code to install the target file.
  const char* no_dir_permissions = 0;
  const char* no_rename = 0;
  bool optional = this->Optional || this->ImportLibrary;
  this->AddInstallRule(os, this->GetDestination(config),
                       type, filesFrom, optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(),
                       indent);

  // Add post-installation tweaks.
  this->AddTweak(os, indent, config, filesTo,
                 &cmInstallTargetGenerator::PostReplacementTweaks);
}